

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

int Bac_NtkDeriveFromPtr(Bac_Ntk_t *pNtk,Vec_Ptr_t *vNtk,Vec_Int_t *vMap,Vec_Int_t *vBox2Id)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint Fanin;
  int iVar4;
  int iVar5;
  Bac_ObjType_t BVar6;
  char *pStr;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  int b;
  int b_00;
  int iVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  Bac_Ntk_t *pBVar14;
  bool bVar15;
  
  iVar13 = 0;
  pVVar9 = vBox2Id;
  pStr = (char *)Vec_PtrEntry(vNtk,0);
  pVVar7 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  p = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  p_00 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
  iVar1 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pStr,(int *)0x0);
  if (pNtk->NameId != iVar1) {
    __assert_fail("Bac_NtkNameId(pNtk) == NameId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x11d,
                  "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (; iVar13 < pVVar7->nSize; iVar13 = iVar13 + 1) {
    pcVar8 = (char *)Vec_PtrEntry(pVVar7,iVar13);
    iVar1 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar8,(int *)0x0);
    iVar2 = Vec_IntGetEntryFull(vMap,iVar1);
    if (iVar2 != -1) {
      pcVar11 = "PI with name \"%s\" is not unique module \"%s\".\n";
LAB_00320a96:
      printf(pcVar11,pcVar8,pStr);
      return 0;
    }
    iVar2 = Bac_ObjAlloc(pNtk,BAC_OBJ_PI,-1);
    Bac_ObjSetName(pNtk,iVar2,iVar1 * 4);
    Vec_IntSetEntryFull(vMap,iVar1,iVar2);
    Bac_NtkAddInfo(pNtk,iVar1 * 4 + 1,b,(int)pVVar9);
  }
  vBox2Id->nSize = 0;
  for (iVar1 = 0; iVar13 = p_00->nSize, iVar1 < iVar13; iVar1 = iVar1 + 1) {
    pVVar7 = (Vec_Ptr_t *)Vec_PtrEntry(p_00,iVar1);
    pcVar8 = (char *)Vec_PtrEntry(pVVar7,0);
    pcVar11 = (char *)Vec_PtrEntry(pVVar7,1);
    uVar3 = Bac_BoxCountOutputs(pNtk,pcVar8);
    iVar13 = pVVar7->nSize;
    Fanin = Bac_ManNtkFindId(pNtk->pDesign,pcVar8);
    if ((pVVar7->nSize & 1U) != 0) {
      __assert_fail("Vec_PtrSize(vBox) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x132,
                    "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (((int)uVar3 < 1) || (pVVar7->nSize < (int)(uVar3 * 2 + 2))) {
      __assert_fail("nOutputs > 0 && 2*(nOutputs + 1) <= Vec_PtrSize(vBox)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x133,
                    "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    iVar2 = strcmp(pcVar8,"Const0T");
    BVar6 = BAC_BOX_CF;
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar8,"Const1T");
      BVar6 = BAC_BOX_CT;
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar8,"BufT");
        BVar6 = BAC_BOX_BUF;
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar8,"InvT");
          BVar6 = BAC_BOX_INV;
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar8,"AndT");
            BVar6 = BAC_BOX_AND;
            if (iVar2 != 0) {
              iVar2 = strcmp(pcVar8,"NandT");
              BVar6 = BAC_BOX_NAND;
              if (iVar2 != 0) {
                iVar2 = strcmp(pcVar8,"OrT");
                BVar6 = BAC_BOX_OR;
                if (iVar2 != 0) {
                  iVar2 = strcmp(pcVar8,"NorT");
                  BVar6 = BAC_BOX_NOR;
                  if (iVar2 != 0) {
                    iVar2 = strcmp(pcVar8,"XorT");
                    BVar6 = BAC_BOX_XOR;
                    if (iVar2 != 0) {
                      iVar2 = strcmp(pcVar8,"XnorT");
                      BVar6 = BAC_OBJ_BOX;
                      if (iVar2 == 0) {
                        BVar6 = BAC_BOX_XNOR;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    for (iVar13 = iVar13 / 2 + ~uVar3; 0 < iVar13; iVar13 = iVar13 + -1) {
      Bac_ObjAlloc(pNtk,BAC_OBJ_BI,-1);
    }
    iVar13 = Bac_ObjAlloc(pNtk,BVar6,Fanin);
    uVar12 = uVar3;
    while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
      Bac_ObjAlloc(pNtk,BAC_OBJ_BO,-1);
    }
    if (0 < (int)Fanin) {
      if (pNtk->pDesign->nNtks < (int)Fanin) {
        pBVar14 = (Bac_Ntk_t *)0x0;
      }
      else {
        pBVar14 = pNtk->pDesign->pNtks + Fanin;
      }
      iVar2 = Bac_NtkId(pNtk);
      if (pBVar14->iBoxNtk != -1) {
        __assert_fail("p->iBoxNtk == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0xee,"void Bac_NtkSetHost(Bac_Ntk_t *, int, int)");
      }
      pBVar14->iBoxNtk = iVar2;
      pBVar14->iBoxObj = iVar13;
    }
    iVar2 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar11,(int *)0x0);
    Bac_ObjSetName(pNtk,iVar13,iVar2 * 4);
    iVar10 = uVar3 * -2 + 1;
    iVar2 = iVar13;
    while ((iVar2 = iVar2 + 1, iVar2 < (pNtk->vType).nSize &&
           (iVar4 = Bac_ObjIsBo(pNtk,iVar2), iVar4 != 0))) {
      pcVar8 = (char *)Vec_PtrEntry(pVVar7,pVVar7->nSize + iVar10);
      iVar4 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar8,(int *)0x0);
      iVar5 = Vec_IntGetEntryFull(vMap,iVar4);
      if (iVar5 != -1) {
        pcVar11 = "Signal \"%s\" has multiple drivers in module \"%s\".\n";
        goto LAB_00320a96;
      }
      Bac_ObjSetName(pNtk,iVar2,iVar4 << 2);
      Vec_IntSetEntryFull(vMap,iVar4,iVar2);
      iVar10 = iVar10 + 2;
    }
    Vec_IntPush(vBox2Id,iVar13);
  }
  if (vBox2Id->nSize != iVar13) {
    __assert_fail("Vec_IntSize(vBox2Id) == Vec_PtrSize(vBoxes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x143,
                  "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar1 = 0;
  pVVar9 = &pNtk->vFanin;
  do {
    iVar2 = 3;
    if (iVar13 <= iVar1) {
      for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
        pcVar8 = (char *)Vec_PtrEntry(p,iVar1);
        iVar13 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar8,(int *)0x0);
        iVar2 = Vec_IntGetEntryFull(vMap,iVar13);
        if (iVar2 == -1) {
          printf("PO with name \"%s\" in not driven in module \"%s\".\n",pcVar8,pStr);
        }
        iVar2 = Vec_IntGetEntryFull(vMap,iVar13);
        Bac_ObjAlloc(pNtk,BAC_OBJ_PO,iVar2);
        Bac_NtkAddInfo(pNtk,iVar13 * 4 + 2,b_00,(int)pVVar9);
      }
      for (iVar1 = 0; iVar1 < (pNtk->vType).nSize; iVar1 = iVar1 + 1) {
        BVar6 = Bac_ObjType(pNtk,iVar1);
        if ((BVar6 == BAC_OBJ_PI) || (iVar13 = Bac_ObjIsBo(pNtk,iVar1), iVar13 != 0)) {
          iVar13 = Bac_ObjNameId(pNtk,iVar1);
          Vec_IntSetEntryFull(vMap,iVar13,-1);
        }
      }
      iVar1 = 0;
      while (iVar1 < vMap->nSize) {
        iVar13 = Vec_IntEntry(vMap,iVar1);
        iVar1 = iVar1 + 1;
        if (iVar13 != -1) {
          __assert_fail("iObj == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                        ,0x15f,
                        "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
      }
      if ((pNtk->vType).nSize == (pNtk->vType).nCap) {
        return 1;
      }
      __assert_fail("Bac_NtkObjNum(pNtk) == Vec_StrCap(&pNtk->vType)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x160,
                    "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    pVVar7 = (Vec_Ptr_t *)Vec_PtrEntry(p_00,iVar1);
    iVar13 = Vec_IntEntry(vBox2Id,iVar1);
    while (0 < iVar13) {
      iVar13 = iVar13 + -1;
      iVar10 = Bac_ObjIsBi(pNtk,iVar13);
      if (iVar10 == 0) break;
      pcVar8 = (char *)Vec_PtrEntry(pVVar7,iVar2);
      iVar10 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar8,(int *)0x0);
      iVar4 = Vec_IntGetEntryFull(vMap,iVar10);
      if (iVar4 == -1) {
        printf("Signal \"%s\" in not driven in module \"%s\".\n",pcVar8,pStr);
      }
      iVar10 = Vec_IntGetEntryFull(vMap,iVar10);
      iVar4 = Bac_ObjFanin(pNtk,iVar13);
      if ((iVar4 != -1) || (iVar4 = Bac_ObjIsCo(pNtk,iVar13), iVar4 == 0)) {
        __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
      }
      Vec_IntSetEntry(&pNtk->vFanin,iVar13,iVar10);
      iVar2 = iVar2 + 2;
    }
    iVar1 = iVar1 + 1;
    iVar13 = p_00->nSize;
  } while( true );
}

Assistant:

int Bac_NtkDeriveFromPtr( Bac_Ntk_t * pNtk, Vec_Ptr_t * vNtk, Vec_Int_t * vMap, Vec_Int_t * vBox2Id )
{
    char * pName, * pModuleName = (char *)Vec_PtrEntry(vNtk, 0);
    Vec_Ptr_t * vInputs  = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vBoxes   = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4), * vBox;
    int i, k, iObj, iTerm, NameId;
    // start network with the given name
    NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pModuleName, NULL );
    assert( Bac_NtkNameId(pNtk) == NameId );
    // map driven NameIds into their ObjIds for PIs
    Vec_PtrForEachEntry( char *, vInputs, pName, i )
    {
        NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
        if ( Vec_IntGetEntryFull(vMap, NameId) != -1 )
            { printf( "PI with name \"%s\" is not unique module \"%s\".\n", pName, pModuleName ); return 0; }
        iObj = Bac_ObjAlloc( pNtk, BAC_OBJ_PI, -1 );
        Bac_ObjSetName( pNtk, iObj, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
        Vec_IntSetEntryFull( vMap, NameId, iObj );
        Bac_NtkAddInfo( pNtk, Abc_Var2Lit2(NameId, 1), -1, -1 );
    }
    // map driven NameIds into their ObjIds for BOs
    Vec_IntClear( vBox2Id );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
    {
        char * pBoxNtk = (char *)Vec_PtrEntry(vBox, 0);
        char * pBoxName = (char *)Vec_PtrEntry(vBox, 1);
        int nOutputs = Bac_BoxCountOutputs( pNtk, pBoxNtk );
        int nInputs = Vec_PtrSize(vBox)/2 - nOutputs - 1;
        int NtkId = Bac_ManNtkFindId( pNtk->pDesign, pBoxNtk );
        assert( Vec_PtrSize(vBox) % 2 == 0 );
        assert( nOutputs > 0 && 2*(nOutputs + 1) <= Vec_PtrSize(vBox) );
        iObj = Bac_BoxAlloc( pNtk, (Bac_ObjType_t)Ptr_NameToType(pBoxNtk), nInputs, nOutputs, NtkId );
        if ( NtkId > 0 )
            Bac_NtkSetHost( Bac_ManNtk(pNtk->pDesign, NtkId), Bac_NtkId(pNtk), iObj );
        Bac_ObjSetName( pNtk, iObj, Abc_Var2Lit2(Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs, pBoxName, NULL), BAC_NAME_BIN) );
        Bac_BoxForEachBo( pNtk, iObj, iTerm, k )
        {
            pName = (char *)Vec_PtrEntry( vBox, Vec_PtrSize(vBox) - 2*(nOutputs - k) + 1 );
            NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
            if ( Vec_IntGetEntryFull(vMap, NameId) != -1 )
                { printf( "Signal \"%s\" has multiple drivers in module \"%s\".\n", pName, pModuleName ); return 0; }
            Bac_ObjSetName( pNtk, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
            Vec_IntSetEntryFull( vMap, NameId, iTerm );
        }
        Vec_IntPush( vBox2Id, iObj );
    }
    assert( Vec_IntSize(vBox2Id) == Vec_PtrSize(vBoxes) );
    // connect BIs
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
    {
        iObj = Vec_IntEntry( vBox2Id, i );
        Bac_BoxForEachBi( pNtk, iObj, iTerm, k )
        {
            pName = (char *)Vec_PtrEntry( vBox, 2*(k + 1) + 1 );
            NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
            if ( Vec_IntGetEntryFull(vMap, NameId) == -1 )
                printf( "Signal \"%s\" in not driven in module \"%s\".\n", pName, pModuleName );
            Bac_ObjSetFanin( pNtk, iTerm, Vec_IntGetEntryFull(vMap, NameId) );
        }
    }
    // connect POs
    Vec_PtrForEachEntry( char *, vOutputs, pName, i )
    {
        NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
        if ( Vec_IntGetEntryFull(vMap, NameId) == -1 )
            printf( "PO with name \"%s\" in not driven in module \"%s\".\n", pName, pModuleName );
        iObj = Bac_ObjAlloc( pNtk, BAC_OBJ_PO, Vec_IntGetEntryFull(vMap, NameId) );
        Bac_NtkAddInfo( pNtk, Abc_Var2Lit2(NameId, 2), -1, -1 );
    }
    // update map
    Bac_NtkForEachCi( pNtk, iObj )
        Vec_IntSetEntryFull( vMap, Bac_ObjNameId(pNtk, iObj), -1 );
    // double check
    Vec_IntForEachEntry( vMap, iObj, i )
        assert( iObj == -1 );
    assert( Bac_NtkObjNum(pNtk) == Vec_StrCap(&pNtk->vType) );
    return 1;
}